

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O2

void LoadActors(void)

{
  FStateTempCall *pFVar1;
  BYTE *pBVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FxExpression *pFVar6;
  undefined4 extraout_var_00;
  VMScriptFunction *pVVar7;
  PPrototype *pPVar8;
  undefined4 extraout_var_01;
  PClassActor *pPVar10;
  long lVar11;
  ulong uVar12;
  int local_1d8;
  FILE *local_1d0;
  cycle_t timer;
  int lastlump;
  TArray<PType_*,_PType_*> args;
  FCompileContext ctx;
  char label [64];
  FScanner sc;
  long *plVar9;
  undefined4 extraout_var;
  
  timer.Sec = 0.0;
  cycle_t::Clock(&timer);
  TArray<FxExpression_*,_FxExpression_*>::Clear
            (&ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>);
  FScriptPosition::ErrorCounter = 0;
  InitThingdef();
  lastlump = 0;
  while (iVar3 = FWadCollection::FindLump(&Wads,"DECORATE",&lastlump,false), iVar3 != -1) {
    FScanner::FScanner(&sc,iVar3);
    ParseDecorate(&sc);
    FScanner::~FScanner(&sc);
  }
  iVar3 = DArgs::CheckParm(Args,"-dumpdisasm",1);
  if (iVar3 == 0) {
    local_1d0 = (FILE *)0x0;
  }
  else {
    local_1d0 = fopen("disasm.txt","w");
  }
  local_1d8 = 0;
  uVar4 = 0;
  while( true ) {
    if (StateTempCalls.super_TArray<FStateTempCall_*,_FStateTempCall_*>.Count <= uVar4) {
      iVar3 = 1;
      uVar4 = 0;
      for (uVar12 = 0; uVar12 < PClassActor::AllActorClasses.Count; uVar12 = uVar12 + 1) {
        pPVar10 = PClassActor::AllActorClasses.Array[uVar12];
        if (*(int *)&(pPVar10->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                     super_PType.super_DObject.field_0x24 == -1) {
          Printf("\x1cGClass %s referenced but not defined\n",
                 FName::NameData.NameArray
                 [(pPVar10->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
          uVar4 = uVar4 + 1;
        }
        else {
          pBVar2 = (pPVar10->super_PClass).Defaults;
          if (pBVar2 == (BYTE *)0x0) {
            Printf("\x1cGNo ActorInfo defined for class \'%s\'\n",
                   FName::NameData.NameArray
                   [(pPVar10->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
            uVar4 = uVar4 + 1;
          }
          else if (*(long *)(pBVar2 + 0x180) != 0) {
            pFVar6 = ActorDamageFuncs.super_TArray<FxExpression_*,_FxExpression_*>.Array
                     [*(long *)(pBVar2 + 0x180) + -1];
            pVVar7 = *(VMScriptFunction **)&pFVar6[1].JumpAddresses.Most;
            if (pVVar7 == (VMScriptFunction *)0x0) {
              FCompileContext::FCompileContext((FCompileContext *)label,pPVar10,(PPrototype *)0x0);
              iVar5 = (*pFVar6->_vptr_FxExpression[2])(pFVar6,(FCompileContext *)label);
              plVar9 = (long *)CONCAT44(extraout_var_01,iVar5);
              if (plVar9 == (long *)0x0) {
                pVVar7 = (VMScriptFunction *)0x0;
              }
              else {
                VMFunctionBuilder::VMFunctionBuilder((VMFunctionBuilder *)&sc);
                VMFunctionBuilder::RegAvailability::Get
                          ((RegAvailability *)(sc.StringBuffer + 0x14),1);
                (**(code **)(*plVar9 + 0x38))(plVar9,(VMFunctionBuilder *)&sc);
                pVVar7 = VMFunctionBuilder::MakeFunction((VMFunctionBuilder *)&sc);
                pVVar7->NumArgs = '\x01';
                (pVVar7->super_VMFunction).Proto = (PPrototype *)0x0;
                plVar9[9] = (long)pVVar7;
                VMFunctionBuilder::~VMFunctionBuilder((VMFunctionBuilder *)&sc);
              }
              TArray<FxJumpStatement_*,_FxJumpStatement_*>::~TArray
                        ((TArray<FxJumpStatement_*,_FxJumpStatement_*> *)label);
            }
            *(VMScriptFunction **)(pBVar2 + 0x180) = pVVar7;
            if ((local_1d0 != (FILE *)0x0) && (pVVar7 != (VMScriptFunction *)0x0)) {
              iVar5 = mysnprintf((char *)&sc,0x40,"Function %s.Damage",
                                 FName::NameData.NameArray
                                 [(pPVar10->super_PClass).super_PStruct.super_PNamedType.TypeName.
                                  Index].Text);
              DumpFunction((FILE *)local_1d0,pVVar7,(char *)&sc,iVar5);
              local_1d8 = local_1d8 + pVVar7->CodeSize;
            }
          }
        }
      }
      if (local_1d0 != (FILE *)0x0) {
        fprintf(local_1d0,
                "\n*************************************************************************\n%i code bytes\n"
                ,(ulong)(uint)(local_1d8 << 2));
        fclose(local_1d0);
      }
      if (0 < (int)uVar4) {
        I_Error("%d errors during actor postprocessing",(ulong)uVar4);
      }
      TDeletingArray<FxExpression_*,_FxExpression_*>::DeleteAndClear(&ActorDamageFuncs);
      TDeletingArray<FStateTempCall_*,_FStateTempCall_*>::DeleteAndClear(&StateTempCalls);
      for (lVar11 = 0; lVar11 != 0xf8; lVar11 = lVar11 + 8) {
        mysnprintf((char *)&sc,0x14,"QuestItem%d",iVar3);
        pPVar10 = PClass::FindActor((char *)&sc);
        *(PClassActor **)((long)QuestItemClasses + lVar11) = pPVar10;
        iVar3 = iVar3 + 1;
      }
      if (0 < FScriptPosition::ErrorCounter) {
        I_Error("%d errors while parsing DECORATE scripts");
      }
      cycle_t::Unclock(&timer);
      if (batchrun == false) {
        Printf("DECORATE parsing took %.2f ms\n",timer.Sec * 1000.0);
      }
      return;
    }
    pFVar1 = StateTempCalls.super_TArray<FStateTempCall_*,_FStateTempCall_*>.Array[uVar4];
    if (pFVar1->Code == (FxExpression *)0x0) break;
    FCompileContext::FCompileContext(&ctx,pFVar1->ActorClass,(PPrototype *)0x0);
    iVar3 = (*pFVar1->Code->_vptr_FxExpression[2])(pFVar1->Code,&ctx);
    pFVar6 = (FxExpression *)CONCAT44(extraout_var,iVar3);
    pFVar1->Code = pFVar6;
    pFVar1->Proto = ctx.ReturnProto;
    if (pFVar6 != (FxExpression *)0x0) {
      iVar3 = (*pFVar6->_vptr_FxExpression[6])(pFVar6);
      pVVar7 = (VMScriptFunction *)CONCAT44(extraout_var_00,iVar3);
      if (pVVar7 == (VMScriptFunction *)0x0) {
        VMFunctionBuilder::VMFunctionBuilder((VMFunctionBuilder *)&sc);
        if (pFVar1->Proto == (PPrototype *)0x0) {
          __assert_fail("tcall->Proto != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef.cpp"
                        ,0x125,"void FinishThingdef()");
        }
        VMFunctionBuilder::RegAvailability::Get((RegAvailability *)(sc.StringBuffer + 0x14),3);
        (*pFVar1->Code->_vptr_FxExpression[7])(pFVar1->Code,(VMFunctionBuilder *)&sc);
        pVVar7 = VMFunctionBuilder::MakeFunction((VMFunctionBuilder *)&sc);
        pVVar7->NumArgs = '\x03';
        TArray<PType_*,_PType_*>::TArray(&args,3);
        SetImplicitArgs(&args,(TArray<unsigned_int,_unsigned_int> *)0x0,pFVar1->ActorClass,6);
        pPVar8 = NewPrototype(&pFVar1->Proto->ReturnTypes,&args);
        (pVVar7->super_VMFunction).Proto = pPVar8;
        if (local_1d0 != (FILE *)0x0) {
          iVar3 = mysnprintf(label,0x40,"Function %s.States[%d] (*%d)",
                             FName::NameData.NameArray
                             [(pFVar1->ActorClass->super_PClass).super_PStruct.super_PNamedType.
                              TypeName.Index].Text,(ulong)(uint)pFVar1->FirstState,
                             (ulong)(uint)pFVar1->NumStates);
          DumpFunction((FILE *)local_1d0,pVVar7,label,iVar3);
          local_1d8 = local_1d8 + pVVar7->CodeSize;
        }
        TArray<PType_*,_PType_*>::~TArray(&args);
        VMFunctionBuilder::~VMFunctionBuilder((VMFunctionBuilder *)&sc);
      }
      if (pFVar1->Code != (FxExpression *)0x0) {
        (*pFVar1->Code->_vptr_FxExpression[1])();
      }
      pFVar1->Code = (FxExpression *)0x0;
      iVar3 = pFVar1->NumStates;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (lVar11 = 0; iVar3 != (int)lVar11; lVar11 = lVar11 + 1) {
        pFVar1->ActorClass->OwnedStates[pFVar1->FirstState + lVar11].ActionFunc =
             &pVVar7->super_VMFunction;
      }
    }
    TArray<FxJumpStatement_*,_FxJumpStatement_*>::~TArray(&ctx.Jumps);
    uVar4 = uVar4 + 1;
  }
  __assert_fail("tcall->Code != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef.cpp"
                ,0x113,"void FinishThingdef()");
}

Assistant:

void LoadActors ()
{
	int lastlump, lump;
	cycle_t timer;

	timer.Reset(); timer.Clock();
	ActorDamageFuncs.Clear();
	FScriptPosition::ResetErrorCounter();
	InitThingdef();
	lastlump = 0;
	while ((lump = Wads.FindLump ("DECORATE", &lastlump)) != -1)
	{
		FScanner sc(lump);
		ParseDecorate (sc);
	}
	FinishThingdef();
	if (FScriptPosition::ErrorCounter > 0)
	{
		I_Error("%d errors while parsing DECORATE scripts", FScriptPosition::ErrorCounter);
	}
	timer.Unclock();
	if (!batchrun) Printf("DECORATE parsing took %.2f ms\n", timer.TimeMS());
	// Base time: ~52 ms
}